

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxSpecific.cpp
# Opt level: O3

int getEthernetRate(int sock,ifreq *item)

{
  int iVar1;
  uint uVar2;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_18 = 0;
  (item->ifr_ifru).ifru_data = &local_3c;
  local_3c = 1;
  iVar1 = ioctl(sock,0x8946,item);
  uVar2 = (uint)(ushort)uStack_30;
  if (iVar1 < 0) {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

int getEthernetRate(int sock, struct ifreq * item)
{
    struct ethtool_cmd eth_data = {0};
    item->ifr_data=(char *)&eth_data;
    eth_data.cmd = ETHTOOL_GSET; /* get setting */
    if (ioctl(sock, SIOCETHTOOL, item) >= 0)
        return eth_data.speed;
    return 0;
}